

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Function * __thiscall wasm::TranslateToFuzzReader::addFunction(TranslateToFuzzReader *this)

{
  Random *this_00;
  Module *pMVar1;
  iterator __position;
  pointer puVar2;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var3;
  pointer ppEVar4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  __node_base_ptr p_Var10;
  char cVar11;
  uint32_t uVar12;
  Function *func;
  Type TVar13;
  Expression *pEVar14;
  uintptr_t *puVar15;
  size_t *psVar16;
  HeapType HVar17;
  uintptr_t extraout_RDX;
  _Head_base<0UL,_wasm::Function_*,_false> _Var18;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  _Head_base<0UL,_wasm::Function_*,_false> _Var19;
  pointer puVar20;
  long lVar21;
  __single_object _Var22;
  Name NVar23;
  Signature SVar24;
  string_view sVar25;
  undefined1 local_120 [8];
  FunctionCreationContext context;
  undefined1 auStack_98 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Function *local_78;
  __single_object allocation;
  undefined1 auStack_58 [8];
  vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> compatibleSegments;
  Type paramType;
  
  this_00 = &this->random;
  uVar12 = Random::upTo(this_00,100);
  uVar12 = Random::upTo(this_00,uVar12);
  this->LOGGING_PERCENT = uVar12;
  func = (Function *)operator_new(0x1d8);
  memset(func,0,0x1d8);
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)&func->type;
  ::wasm::HeapType::HeapType(&func->type,(Signature)ZEXT816(0));
  func->profile = Normal;
  (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func->body = (Expression *)0x0;
  (func->localNames)._M_h._M_buckets = &(func->localNames)._M_h._M_single_bucket;
  (func->localNames)._M_h._M_bucket_count = 1;
  (func->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->localNames)._M_h._M_element_count = 0;
  (func->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->localIndices)._M_h._M_buckets = &(func->localIndices)._M_h._M_single_bucket;
  (func->localIndices)._M_h._M_bucket_count = 1;
  (func->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->localIndices)._M_h._M_element_count = 0;
  (func->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->debugLocations)._M_h._M_buckets = &(func->debugLocations)._M_h._M_single_bucket;
  (func->debugLocations)._M_h._M_bucket_count = 1;
  (func->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->debugLocations)._M_h._M_element_count = 0;
  (func->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (func->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (func->expressionLocations)._M_h._M_buckets = &(func->expressionLocations)._M_h._M_single_bucket;
  (func->expressionLocations)._M_h._M_bucket_count = 1;
  (func->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->expressionLocations)._M_h._M_element_count = 0;
  (func->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->delimiterLocations)._M_h._M_buckets = &(func->delimiterLocations)._M_h._M_single_bucket;
  (func->delimiterLocations)._M_h._M_bucket_count = 1;
  (func->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->delimiterLocations)._M_h._M_element_count = 0;
  (func->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(func->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
  (func->funcLocation).declarations = 0;
  (func->funcLocation).end = 0;
  (func->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (func->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  func->noFullInline = false;
  func->noPartialInline = false;
  pMVar1 = this->wasm;
  local_78 = func;
  NVar23.super_IString.str = (IString)::wasm::IString::interned(4,"func",0);
  sVar25 = (string_view)Names::getValidFunctionName(pMVar1,NVar23);
  (func->super_Importable).super_Named.name.super_IString.str = sVar25;
  uVar12 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_PARAMS);
  uVar12 = Random::upTo(this_00,uVar12);
  auStack_98 = (undefined1  [8])0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98,(ulong)uVar12);
  if (uVar12 != 0) {
    do {
      local_120 = (undefined1  [8])getSingleConcreteType(this);
      if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_98,
                   (iterator)
                   params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,(Type *)local_120);
      }
      else {
        (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)local_120;
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  ::wasm::Type::Type((Type *)&compatibleSegments.
                              super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,auStack_98);
  TVar13 = getControlFlowType(this);
  SVar24.results.id = TVar13.id;
  SVar24.params.id =
       (uintptr_t)
       compatibleSegments.
       super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  ::wasm::HeapType::HeapType((HeapType *)local_120,SVar24);
  (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage)->id = (uintptr_t)local_120;
  uVar12 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_VARS);
  uVar12 = Random::upTo(this_00,uVar12);
  if (uVar12 != 0) {
    do {
      local_120 = (undefined1  [8])getConcreteType(this);
      cVar11 = ::wasm::TypeUpdating::canHandleAsLocal((Type)local_120);
      if (cVar11 == '\0') {
        local_120 = (undefined1  [8])0x2;
      }
      __position._M_current =
           (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)&func->vars,__position,
                   (Type *)local_120);
      }
      else {
        (__position._M_current)->id = (uintptr_t)local_120;
        (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  FunctionCreationContext::FunctionCreationContext((FunctionCreationContext *)local_120,this,func);
  ::wasm::HeapType::getSignature();
  uVar12 = Random::upTo(this_00,10);
  TVar13.id = extraout_RDX;
  if (uVar12 == 0) {
    TVar13.id = 1;
  }
  uVar12 = Random::upTo(this_00,2);
  if (uVar12 == 0) {
    pEVar14 = makeBlock(this,TVar13);
  }
  else {
    pEVar14 = make(this,TVar13);
  }
  func->body = pEVar14;
  ::wasm::Module::addFunction((unique_ptr *)this->wasm);
  allocation._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       Type::size((Type *)&compatibleSegments.
                           super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((long)allocation._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl >> 2 < 1) {
    _Var18._M_head_impl = (Function *)0x0;
  }
  else {
    lVar21 = ((long)allocation._M_t.
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl >> 2) + 1;
    _Var18._M_head_impl = (Function *)0x0;
    do {
      auStack_58 = (undefined1  [8])
                   &compatibleSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var18._M_head_impl;
      puVar15 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      paramType.id = *puVar15;
      cVar11 = ::wasm::Type::isDefaultable();
      _Var19._M_head_impl = _Var18._M_head_impl;
      _Var22 = allocation;
      if (cVar11 == '\0') goto LAB_00143f46;
      _Var19._M_head_impl =
           (Function *)
           ((long)&((_Var18._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_len + 1);
      auStack_58 = (undefined1  [8])
                   &compatibleSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var19._M_head_impl;
      puVar15 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      paramType.id = *puVar15;
      cVar11 = ::wasm::Type::isDefaultable();
      _Var22 = allocation;
      if (cVar11 == '\0') goto LAB_00143f46;
      _Var19._M_head_impl =
           (Function *)
           ((long)&((_Var18._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_len + 2);
      auStack_58 = (undefined1  [8])
                   &compatibleSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var19._M_head_impl;
      puVar15 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      paramType.id = *puVar15;
      cVar11 = ::wasm::Type::isDefaultable();
      _Var22 = allocation;
      if (cVar11 == '\0') goto LAB_00143f46;
      _Var19._M_head_impl =
           (Function *)
           ((long)&((_Var18._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_len + 3);
      auStack_58 = (undefined1  [8])
                   &compatibleSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var19._M_head_impl;
      puVar15 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      paramType.id = *puVar15;
      cVar11 = ::wasm::Type::isDefaultable();
      _Var22 = allocation;
      if (cVar11 == '\0') goto LAB_00143f46;
      _Var18._M_head_impl =
           (Function *)
           ((long)&((_Var18._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_len + 4);
      lVar21 = lVar21 + -1;
    } while (1 < lVar21);
  }
  _Var22._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       allocation._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
       _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  lVar21 = (long)allocation._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl -
           (long)_Var18._M_head_impl;
  if (lVar21 == 1) {
LAB_00143f0b:
    auStack_58 = (undefined1  [8])
                 &compatibleSegments.
                  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_Var18._M_head_impl;
    puVar15 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_58);
    paramType.id = *puVar15;
    cVar11 = ::wasm::Type::isDefaultable();
    _Var19._M_head_impl = _Var18._M_head_impl;
    if (cVar11 == '\0') goto LAB_00143f46;
  }
  else {
    if (lVar21 == 2) {
LAB_00143ee1:
      auStack_58 = (undefined1  [8])
                   &compatibleSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var18._M_head_impl;
      puVar15 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      paramType.id = *puVar15;
      cVar11 = ::wasm::Type::isDefaultable();
      _Var19._M_head_impl = _Var18._M_head_impl;
      if (cVar11 == '\0') goto LAB_00143f46;
      _Var18._M_head_impl =
           (Function *)
           ((long)&((_Var18._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_len + 1);
      goto LAB_00143f0b;
    }
    if (lVar21 == 3) {
      auStack_58 = (undefined1  [8])
                   &compatibleSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var18._M_head_impl;
      puVar15 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      paramType.id = *puVar15;
      cVar11 = ::wasm::Type::isDefaultable();
      _Var19._M_head_impl = _Var18._M_head_impl;
      if (cVar11 == '\0') goto LAB_00143f46;
      _Var18._M_head_impl = _Var18._M_head_impl + 1;
      goto LAB_00143ee1;
    }
  }
  _Var19._M_head_impl =
       (Function *)
       _Var22._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
LAB_00143f46:
  context.typeLocals._M_h._M_single_bucket = (__node_base_ptr)func;
  if (((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       _Var19._M_head_impl ==
       (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
       _Var22._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) &&
     ((((this->numAddedFunctions == 0 || (uVar12 = Random::upTo(this_00,2), uVar12 == 0)) &&
       (NVar23.super_IString.str._M_str =
             (char *)(func->super_Importable).super_Named.name.super_IString.str._M_len,
       NVar23.super_IString.str._M_len = (size_t)this->wasm,
       lVar21 = ::wasm::Module::getExportOrNull(NVar23), lVar21 == 0)) &&
      (this->preserveImportsAndExports == false)))) {
    pMVar1 = this->wasm;
    psVar16 = (size_t *)operator_new(0x30);
    sVar7 = (func->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar8 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
    pcVar9 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
    psVar16[3] = (func->super_Importable).super_Named.name.super_IString.str._M_len;
    psVar16[4] = (size_t)pcVar9;
    *psVar16 = sVar7;
    psVar16[1] = (size_t)pcVar8;
    *(undefined4 *)(psVar16 + 2) = 0;
    *(undefined1 *)(psVar16 + 5) = 0;
    ::wasm::Module::addExport((Export *)pMVar1);
  }
  while( true ) {
    p_Var10 = context.typeLocals._M_h._M_single_bucket;
    uVar12 = Random::upTo(this_00,3);
    if ((uVar12 != 0) || ((this->random).finishedInput != false)) break;
    TVar13 = (Type)(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage)->id;
    if (((uint)(0x7c < TVar13.id) * 4 + 3 & (uint)TVar13.id) != 0) {
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
    auStack_58 = (undefined1  [8])0x0;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar2 = (this->wasm->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar20 = (this->wasm->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar2;
        puVar20 = puVar20 + 1) {
      _Var3._M_head_impl =
           (puVar20->_M_t).
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if ((*(char **)((long)&(_Var3._M_head_impl)->table + 8) != (char *)0x0) &&
         (paramType.id = (uintptr_t)_Var3._M_head_impl,
         cVar11 = ::wasm::Type::isSubType(TVar13,(Type)((_Var3._M_head_impl)->type).id),
         cVar11 != '\0')) {
        if (compatibleSegments.
            super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            compatibleSegments.
            super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>>::
          _M_realloc_insert<wasm::ElementSegment*const&>
                    ((vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>> *)
                     auStack_58,
                     (iterator)
                     compatibleSegments.
                     super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,(ElementSegment **)&paramType);
        }
        else {
          *compatibleSegments.
           super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
           _M_impl.super__Vector_impl_data._M_start = (ElementSegment *)paramType.id;
          compatibleSegments.
          super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
    }
    uVar12 = Random::upTo(this_00,(uint32_t)
                                  ((ulong)((long)compatibleSegments.
                                                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start -
                                          (long)auStack_58) >> 3));
    ppEVar4 = *(pointer *)((long)auStack_58 + (ulong)uVar12 * 8);
    p_Var5 = p_Var10->_M_nxt;
    p_Var6 = p_Var10[1]._M_nxt;
    HVar17.id = (uintptr_t)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    *(undefined1 *)HVar17.id = 0x2b;
    *(undefined8 *)(HVar17.id + 8) = 0;
    *(undefined8 *)(HVar17.id + 0x10) = 0;
    *(_Hash_node_base **)(HVar17.id + 0x10) = p_Var5;
    *(_Hash_node_base **)(HVar17.id + 0x18) = p_Var6;
    ::wasm::RefFunc::finalize(HVar17);
    paramType.id = HVar17.id;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)(ppEVar4 + 7),
               (Expression **)&paramType);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)compatibleSegments.
                            super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  this->numAddedFunctions = this->numAddedFunctions + 1;
  FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)local_120);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)auStack_98);
  }
  if (local_78 != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_78,local_78);
  }
  return (Function *)p_Var10;
}

Assistant:

Function* TranslateToFuzzReader::addFunction() {
  LOGGING_PERCENT = upToSquared(100);
  auto allocation = std::make_unique<Function>();
  auto* func = allocation.get();
  func->name = Names::getValidFunctionName(wasm, "func");
  Index numParams = upToSquared(fuzzParams->MAX_PARAMS);
  std::vector<Type> params;
  params.reserve(numParams);
  for (Index i = 0; i < numParams; i++) {
    auto type = getSingleConcreteType();
    params.push_back(type);
  }
  auto paramType = Type(params);
  auto resultType = getControlFlowType();
  func->type = Signature(paramType, resultType);
  Index numVars = upToSquared(fuzzParams->MAX_VARS);
  for (Index i = 0; i < numVars; i++) {
    auto type = getConcreteType();
    if (!TypeUpdating::canHandleAsLocal(type)) {
      type = Type::i32;
    }
    func->vars.push_back(type);
  }
  // Generate the function creation context after we filled in locals, which it
  // will scan.
  FunctionCreationContext context(*this, func);
  // with small chance, make the body unreachable
  auto bodyType = func->getResults();
  if (oneIn(10)) {
    bodyType = Type::unreachable;
  }
  // with reasonable chance make the body a block
  if (oneIn(2)) {
    func->body = makeBlock(bodyType);
  } else {
    func->body = make(bodyType);
  }

  // Add hang limit checks after all other operations on the function body.
  wasm.addFunction(std::move(allocation));
  // Export some functions, but not all (to allow inlining etc.). Try to export
  // at least one, though, to keep each testcase interesting. Avoid non-
  // nullable params, as those cannot be constructed by the fuzzer on the
  // outside.
  bool validExportParams =
    std::all_of(paramType.begin(), paramType.end(), [&](Type t) {
      return t.isDefaultable();
    });
  if (validExportParams && (numAddedFunctions == 0 || oneIn(2)) &&
      !wasm.getExportOrNull(func->name) && !preserveImportsAndExports) {
    wasm.addExport(new Export(func->name, ExternalKind::Function, func->name));
  }
  // add some to an elem segment
  while (oneIn(3) && !random.finished()) {
    auto type = Type(func->type, NonNullable);
    std::vector<ElementSegment*> compatibleSegments;
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      if (Type::isSubType(type, segment->type)) {
        compatibleSegments.push_back(segment);
      }
    });
    auto& randomElem = compatibleSegments[upTo(compatibleSegments.size())];
    randomElem->data.push_back(builder.makeRefFunc(func->name, func->type));
  }
  numAddedFunctions++;
  return func;
}